

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMNode.hpp
# Opt level: O0

CMStateSet * __thiscall xercesc_4_0::CMNode::getLastPos(CMNode *this)

{
  CMStateSet *this_00;
  CMNode *this_local;
  
  if (this->fLastPos == (CMStateSet *)0x0) {
    this_00 = (CMStateSet *)XMemory::operator_new(0x20,this->fMemoryManager);
    CMStateSet::CMStateSet(this_00,(ulong)this->fMaxStates,this->fMemoryManager);
    this->fLastPos = this_00;
    (*this->_vptr_CMNode[4])(this,this->fLastPos);
  }
  return this->fLastPos;
}

Assistant:

inline const CMStateSet& CMNode::getLastPos()
{
    //
    //  Fault in the state set if needed. Since we can't use mutable members
    //  cast off the const'ness.
    //
    if (!fLastPos)
    {
        fLastPos = new (fMemoryManager) CMStateSet(fMaxStates, fMemoryManager);
        calcLastPos(*fLastPos);
    }
    return *fLastPos;
}